

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space_factory.h
# Opt level: O0

size_type __thiscall
projects::dpg::ProductUniformFESpaceFactory<double>::AddL2Component
          (ProductUniformFESpaceFactory<double> *this,size_type degree)

{
  size_type sVar1;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_b8;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_a8;
  RefElType local_91;
  undefined1 local_90 [32];
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_70 [2];
  RefElType local_49;
  undefined1 local_48 [32];
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_28;
  size_type local_14;
  ProductUniformFESpaceFactory<double> *pPStack_10;
  size_type degree_local;
  ProductUniformFESpaceFactory<double> *this_local;
  
  local_14 = degree;
  pPStack_10 = this;
  local_49 = (RefElType)lf::base::RefEl::kTria();
  ReferenceFiniteElement
            ((ProductUniformFESpaceFactory<double> *)local_48,(RefEl)(RefElType)this,(uint)local_49)
  ;
  std::
  make_shared<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>,std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)(local_48 + 0x10));
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_28,
             (shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_> *)
             (local_48 + 0x10));
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_tria_v_,(value_type *)&local_28);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_28);
  std::shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_> *)
             (local_48 + 0x10));
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)local_48);
  local_91 = (RefElType)lf::base::RefEl::kQuad();
  ReferenceFiniteElement
            ((ProductUniformFESpaceFactory<double> *)local_90,(RefEl)(RefElType)this,(uint)local_91)
  ;
  std::
  make_shared<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>,std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>>
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)(local_90 + 0x10));
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)local_70,
             (shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_> *)
             (local_90 + 0x10));
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_quad_v_,(value_type *)local_70);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(local_70);
  std::shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<projects::dpg::DiscontinuousScalarReferenceFiniteElement<double>_> *)
             (local_90 + 0x10));
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)local_90);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&local_a8,(nullptr_t)0x0);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_segment_v_,&local_a8);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_a8);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::shared_ptr
            (&local_b8,(nullptr_t)0x0);
  std::
  vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ::push_back(&this->rfs_point_v_,&local_b8);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_b8);
  sVar1 = this->num_components_;
  this->num_components_ = sVar1 + 1;
  return sVar1;
}

Assistant:

size_type ProductUniformFESpaceFactory<SCALAR>::AddL2Component(
    size_type degree) {
  // add discontinuous shape functions to triangles and quads.
  rfs_tria_v_.push_back(
      std::make_shared<DiscontinuousScalarReferenceFiniteElement<SCALAR>>(
          ReferenceFiniteElement(lf::base::RefEl::kTria(), degree)));
  rfs_quad_v_.push_back(
      std::make_shared<DiscontinuousScalarReferenceFiniteElement<SCALAR>>(
          ReferenceFiniteElement(lf::base::RefEl::kQuad(), degree)));
  rfs_segment_v_.push_back(nullptr);
  rfs_point_v_.push_back(nullptr);
  return num_components_++;
}